

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O0

ostream * operator<<(ostream *os,JournalOperation *opj)

{
  ostream *poVar1;
  char *pcVar2;
  void *this;
  string *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Operation: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," applied on ");
  pcVar2 = ctime((time_t *)(in_RSI + 0x20));
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(in_RDI,"Tool: ");
  poVar1 = std::operator<<(poVar1,in_RSI + 0x28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Details: ");
  poVar1 = std::operator<<(poVar1,in_RSI + 0x48);
  this = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const JournalOperation &opj) {
    os << "Operation: " << opj.name << " applied on " << ctime(&opj.timestamp);
    os << "Tool: " << opj.tool << std::endl;
    os << "Details: " << opj.detail << std::endl << std::endl;
    return os;
}